

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForeachLoopStatementSyntax *syntax)

{
  SourceLocation defaultLoc;
  StatementBlockSymbol *pSVar1;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar2;
  StatementSyntax *in_stack_ffffffffffffffd0;
  string_view local_28;
  
  defaultLoc = parsing::Token::location(&syntax->keyword);
  getLabel((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *)
           &stack0xffffffffffffffd0,&syntax->super_StatementSyntax,defaultLoc);
  pSVar1 = createBlock((ast *)scope,(Scope *)syntax,in_stack_ffffffffffffffd0,local_28,
                       (SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffd0);
  sVar2 = Statement::createAndAddBlockItems(&pSVar1->super_Scope,(syntax->statement).ptr,false);
  pSVar1->blocks = sVar2;
  Scope::getOrAddDeferredData(&pSVar1->super_Scope);
  return pSVar1;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForeachLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.keyword.location());
    auto result = createBlock(scope, syntax, name, loc);
    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);

    // This block needs elaboration to collect iteration variables.
    result->setNeedElaboration();

    return *result;
}